

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O0

int getFontWeight(QString *weightString)

{
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QLatin1StringView s_03;
  bool bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QLatin1StringView QVar5;
  QString translatedDemi;
  QString translatedExtra;
  QString translatedLight;
  QString translatedBold;
  QStringView s2;
  QString s;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcbc;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  undefined4 in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd4;
  undefined4 in_stack_fffffffffffffcd8;
  undefined1 in_stack_fffffffffffffcdc;
  bool bVar6;
  undefined1 in_stack_fffffffffffffcdd;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 in_stack_fffffffffffffce0 [16];
  int local_29c;
  char local_298 [24];
  undefined1 *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char local_268 [24];
  undefined1 *local_250;
  undefined1 *local_248;
  undefined1 *local_240;
  char local_238 [24];
  char local_220 [24];
  char local_208 [24];
  char local_1f0 [24];
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char local_1c0 [24];
  char local_1a8 [24];
  char local_190 [24];
  char local_178 [24];
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  char local_148 [24];
  QLatin1StringView local_130;
  QLatin1StringView local_120;
  QLatin1StringView local_110;
  QLatin1StringView local_100;
  QStringView local_e0;
  QLatin1StringView local_d0;
  QLatin1StringView local_c0;
  QLatin1StringView local_b0;
  QLatin1StringView local_a0;
  QLatin1StringView local_90;
  QLatin1StringView local_80;
  QLatin1StringView local_70;
  QLatin1StringView local_60;
  QLatin1StringView local_50;
  QLatin1StringView local_40;
  QLatin1StringView local_30;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLower((QString *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
  local_30 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  bVar1 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (QLatin1StringView *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  uVar8 = true;
  if (!bVar1) {
    local_40 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                          CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    uVar8 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  }
  if ((bool)uVar8 != false) {
    local_29c = 400;
    goto LAB_0073ca6b;
  }
  local_50 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  bVar1 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (QLatin1StringView *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  if (bVar1) {
    local_29c = 700;
    goto LAB_0073ca6b;
  }
  local_60 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  bVar1 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (QLatin1StringView *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  uVar7 = true;
  if (!bVar1) {
    local_70 = Qt::Literals::StringLiterals::operator____L1
                         ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                          CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    bVar1 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    uVar7 = true;
    if (!bVar1) {
      local_80 = Qt::Literals::StringLiterals::operator____L1
                           ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                            CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      bVar1 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                         (QLatin1StringView *)
                         CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      uVar7 = true;
      if (!bVar1) {
        local_90 = Qt::Literals::StringLiterals::operator____L1
                             ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                              CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        uVar7 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                           (QLatin1StringView *)
                           CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      }
    }
  }
  if ((bool)uVar7 != false) {
    local_29c = 600;
    goto LAB_0073ca6b;
  }
  local_a0 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  bVar1 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (QLatin1StringView *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  if (bVar1) {
    local_29c = 500;
    goto LAB_0073ca6b;
  }
  local_b0 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  bVar1 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (QLatin1StringView *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  if (bVar1) {
    local_29c = 900;
    goto LAB_0073ca6b;
  }
  local_c0 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  bVar1 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (QLatin1StringView *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  if (bVar1) {
    local_29c = 300;
    goto LAB_0073ca6b;
  }
  local_d0 = Qt::Literals::StringLiterals::operator____L1
                       ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                        CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  bVar1 = operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     (QLatin1StringView *)
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  if (bVar1) {
    local_29c = 100;
    goto LAB_0073ca6b;
  }
  local_e0.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
  local_e0.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0),
             (QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  local_e0 = QStringView::mid((QStringView *)
                              CONCAT17(uVar8,CONCAT16(uVar7,CONCAT15(in_stack_fffffffffffffcdd,
                                                                     CONCAT14(
                                                  in_stack_fffffffffffffcdc,
                                                  in_stack_fffffffffffffcd8)))),
                              in_stack_fffffffffffffce0._8_8_,in_stack_fffffffffffffce0._0_8_);
  QVar5 = Qt::Literals::StringLiterals::operator____L1
                    ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                     CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  uVar4 = QString::startsWith((QLatin1String *)&local_20,(CaseSensitivity)QVar5.m_size);
  if ((uVar4 & 1) == 0) {
    QVar5 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                       CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    uVar4 = QString::startsWith((QLatin1String *)&local_20,(CaseSensitivity)QVar5.m_size);
    if ((uVar4 & 1) != 0) goto LAB_0073c0ac;
  }
  else {
LAB_0073c0ac:
    local_100 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                           CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    bVar1 = operator==((QStringView *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    in_stack_fffffffffffffcdd = true;
    if (!bVar1) {
      local_110 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      in_stack_fffffffffffffcdd =
           operator==((QString *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                      (QLatin1StringView *)
                      CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    }
    if ((bool)in_stack_fffffffffffffcdd != false) {
      local_29c = 200;
      goto LAB_0073ca6b;
    }
    local_120 = Qt::Literals::StringLiterals::operator____L1
                          ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                           CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    bVar1 = operator==((QStringView *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                       (QLatin1StringView *)
                       CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    bVar6 = true;
    if (!bVar1) {
      local_130 = Qt::Literals::StringLiterals::operator____L1
                            ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      bVar6 = operator==((QStringView *)
                         CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                         (QLatin1StringView *)
                         CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
    }
    if (bVar6 != false) {
      local_29c = 800;
      goto LAB_0073ca6b;
    }
    in_stack_fffffffffffffcdc = 0;
  }
  Qt::Literals::StringLiterals::operator____L1
            ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  QVar5.m_size._4_4_ = in_stack_fffffffffffffcd4;
  QVar5.m_size._0_4_ = in_stack_fffffffffffffcd0;
  QVar5.m_data._0_4_ = in_stack_fffffffffffffcd8;
  QVar5.m_data._4_1_ = in_stack_fffffffffffffcdc;
  QVar5.m_data._5_1_ = in_stack_fffffffffffffcdd;
  QVar5.m_data._6_1_ = uVar7;
  QVar5.m_data._7_1_ = uVar8;
  bVar1 = QString::contains((QString *)CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                            ,QVar5,CaseInsensitive);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
               CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    s_00.m_size._4_4_ = in_stack_fffffffffffffcd4;
    s_00.m_size._0_4_ = in_stack_fffffffffffffcd0;
    s_00.m_data._0_4_ = in_stack_fffffffffffffcd8;
    s_00.m_data._4_1_ = in_stack_fffffffffffffcdc;
    s_00.m_data._5_1_ = in_stack_fffffffffffffcdd;
    s_00.m_data._6_1_ = uVar7;
    s_00.m_data._7_1_ = uVar8;
    bVar1 = QString::contains((QString *)
                              CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),s_00,
                              CaseInsensitive);
    if (bVar1) {
      local_29c = 600;
    }
    else {
      local_29c = 700;
    }
  }
  else {
    Qt::Literals::StringLiterals::operator____L1
              ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
               CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
    s_01.m_size._4_4_ = in_stack_fffffffffffffcd4;
    s_01.m_size._0_4_ = in_stack_fffffffffffffcd0;
    s_01.m_data._0_4_ = in_stack_fffffffffffffcd8;
    s_01.m_data._4_1_ = in_stack_fffffffffffffcdc;
    s_01.m_data._5_1_ = in_stack_fffffffffffffcdd;
    s_01.m_data._6_1_ = uVar7;
    s_01.m_data._7_1_ = uVar8;
    bVar1 = QString::contains((QString *)
                              CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),s_01,
                              CaseInsensitive);
    if (bVar1) {
      local_29c = 100;
    }
    else {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                 CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
      s_02.m_size._4_4_ = in_stack_fffffffffffffcd4;
      s_02.m_size._0_4_ = in_stack_fffffffffffffcd0;
      s_02.m_data._0_4_ = in_stack_fffffffffffffcd8;
      s_02.m_data._4_1_ = in_stack_fffffffffffffcdc;
      s_02.m_data._5_1_ = in_stack_fffffffffffffcdd;
      s_02.m_data._6_1_ = uVar7;
      s_02.m_data._7_1_ = uVar8;
      bVar1 = QString::contains((QString *)
                                CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),s_02,
                                CaseInsensitive);
      if (bVar1) {
        local_29c = 300;
      }
      else {
        Qt::Literals::StringLiterals::operator____L1
                  ((char *)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8),
                   CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
        s_03.m_size._4_4_ = in_stack_fffffffffffffcd4;
        s_03.m_size._0_4_ = in_stack_fffffffffffffcd0;
        s_03.m_data._0_4_ = in_stack_fffffffffffffcd8;
        s_03.m_data._4_1_ = in_stack_fffffffffffffcdc;
        s_03.m_data._5_1_ = in_stack_fffffffffffffcdd;
        s_03.m_data._6_1_ = uVar7;
        s_03.m_data._7_1_ = uVar8;
        bVar1 = QString::contains((QString *)
                                  CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8),s_03
                                  ,CaseInsensitive);
        if (bVar1) {
          local_29c = 900;
        }
        else {
          QCoreApplication::translate(local_148,"QFontDatabase","Normal",0xbcc12c);
          iVar2 = QString::compare((QString *)&local_20,(CaseSensitivity)local_148);
          QString::~QString((QString *)0x73c3fa);
          if (iVar2 == 0) {
            local_29c = 400;
          }
          else {
            local_160 = &DAT_aaaaaaaaaaaaaaaa;
            local_158 = &DAT_aaaaaaaaaaaaaaaa;
            local_150 = &DAT_aaaaaaaaaaaaaaaa;
            QCoreApplication::translate(local_178,"QFontDatabase","Bold",0);
            QString::toLower((QString *)
                             CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
            QString::~QString((QString *)0x73c492);
            bVar1 = operator==((QString *)
                               CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
                               (QString *)
                               CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
            if (bVar1) {
              local_29c = 700;
            }
            else {
              QCoreApplication::translate(local_190,"QFontDatabase","Demi Bold",0);
              iVar2 = QString::compare((QString *)&local_20,(CaseSensitivity)local_190);
              QString::~QString((QString *)0x73c515);
              if (iVar2 == 0) {
                local_29c = 600;
              }
              else {
                QCoreApplication::translate(local_1a8,"QFontDatabase","Medium",0xbcc15f);
                iVar2 = QString::compare((QString *)&local_20,(CaseSensitivity)local_1a8);
                QString::~QString((QString *)0x73c589);
                if (iVar2 == 0) {
                  local_29c = 500;
                }
                else {
                  QCoreApplication::translate(local_1c0,"QFontDatabase","Black",0);
                  iVar2 = QString::compare((QString *)&local_20,(CaseSensitivity)local_1c0);
                  QString::~QString((QString *)0x73c5fa);
                  if (iVar2 == 0) {
                    local_29c = 900;
                  }
                  else {
                    local_1d8 = &DAT_aaaaaaaaaaaaaaaa;
                    local_1d0 = &DAT_aaaaaaaaaaaaaaaa;
                    local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
                    QCoreApplication::translate(local_1f0,"QFontDatabase","Light",0);
                    QString::toLower((QString *)
                                     CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8));
                    QString::~QString((QString *)0x73c692);
                    bVar1 = operator==((QString *)
                                       CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0)
                                       ,(QString *)
                                        CONCAT44(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8
                                                ));
                    if (bVar1) {
                      local_29c = 300;
                    }
                    else {
                      QCoreApplication::translate(local_208,"QFontDatabase","Thin",0);
                      iVar2 = QString::compare((QString *)&local_20,(CaseSensitivity)local_208);
                      QString::~QString((QString *)0x73c715);
                      if (iVar2 == 0) {
                        local_29c = 100;
                      }
                      else {
                        QCoreApplication::translate(local_220,"QFontDatabase","Extra Light",0);
                        iVar2 = QString::compare((QString *)&local_20,(CaseSensitivity)local_220);
                        QString::~QString((QString *)0x73c786);
                        if (iVar2 == 0) {
                          local_29c = 200;
                        }
                        else {
                          QCoreApplication::translate(local_238,"QFontDatabase","Extra Bold",0);
                          iVar3 = QString::compare((QString *)&local_20,(CaseSensitivity)local_238);
                          QString::~QString((QString *)0x73c7f7);
                          if (iVar3 == 0) {
                            local_29c = 800;
                          }
                          else {
                            local_250 = &DAT_aaaaaaaaaaaaaaaa;
                            local_248 = &DAT_aaaaaaaaaaaaaaaa;
                            local_240 = &DAT_aaaaaaaaaaaaaaaa;
                            QCoreApplication::translate(local_268,"QFontDatabase","Extra",0);
                            QString::toLower((QString *)
                                             CONCAT44(in_stack_fffffffffffffcbc,
                                                      in_stack_fffffffffffffcb8));
                            QString::~QString((QString *)0x73c88f);
                            bVar1 = QString::contains((QString *)CONCAT44(iVar2,iVar3),
                                                      (QString *)
                                                      CONCAT44(in_stack_fffffffffffffcbc,
                                                               in_stack_fffffffffffffcb8),
                                                      CaseInsensitive);
                            if (bVar1) {
                              local_280 = &DAT_aaaaaaaaaaaaaaaa;
                              local_278 = &DAT_aaaaaaaaaaaaaaaa;
                              local_270 = &DAT_aaaaaaaaaaaaaaaa;
                              QCoreApplication::translate(local_298,"QFontDatabase","Demi",0);
                              QString::toLower((QString *)
                                               CONCAT44(in_stack_fffffffffffffcbc,
                                                        in_stack_fffffffffffffcb8));
                              QString::~QString((QString *)0x73c926);
                              bVar1 = QString::contains((QString *)CONCAT44(iVar2,iVar3),
                                                        (QString *)
                                                        CONCAT44(in_stack_fffffffffffffcbc,
                                                                 in_stack_fffffffffffffcb8),
                                                        CaseInsensitive);
                              if (bVar1) {
                                local_29c = 600;
                              }
                              else {
                                bVar1 = QString::contains((QString *)CONCAT44(iVar2,iVar3),
                                                          (QString *)
                                                          CONCAT44(in_stack_fffffffffffffcbc,
                                                                   in_stack_fffffffffffffcb8),
                                                          CaseInsensitive);
                                if (bVar1) {
                                  local_29c = 800;
                                }
                                else {
                                  local_29c = 700;
                                }
                              }
                              QString::~QString((QString *)0x73c9b9);
                            }
                            else {
                              bVar1 = QString::contains((QString *)CONCAT44(iVar2,iVar3),
                                                        (QString *)
                                                        CONCAT44(in_stack_fffffffffffffcbc,
                                                                 in_stack_fffffffffffffcb8),
                                                        CaseInsensitive);
                              if (bVar1) {
                                bVar1 = QString::contains((QString *)CONCAT44(iVar2,iVar3),
                                                          (QString *)
                                                          CONCAT44(in_stack_fffffffffffffcbc,
                                                                   in_stack_fffffffffffffcb8),
                                                          CaseInsensitive);
                                if (bVar1) {
                                  local_29c = 200;
                                }
                                else {
                                  local_29c = 300;
                                }
                              }
                              else {
                                local_29c = 400;
                              }
                            }
                            QString::~QString((QString *)0x73ca51);
                          }
                        }
                      }
                    }
                    QString::~QString((QString *)0x73ca5e);
                  }
                }
              }
            }
            QString::~QString((QString *)0x73ca6b);
          }
        }
      }
    }
  }
LAB_0073ca6b:
  QString::~QString((QString *)0x73ca78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_29c;
}

Assistant:

static int getFontWeight(const QString &weightString)
{
    QString s = weightString.toLower();

    // Order here is important. We want to match the common cases first, but we
    // must also take care to acknowledge the cost of our tests.
    //
    // As a result, we test in two orders; the order of commonness, and the
    // order of "expense".
    //
    // A simple string test is the cheapest, so let's do that first.
    // Test in decreasing order of commonness
    if (s == "normal"_L1 || s == "regular"_L1)
        return QFont::Normal;
    if (s == "bold"_L1)
        return QFont::Bold;
    if (s == "semibold"_L1 || s == "semi bold"_L1 || s == "demibold"_L1 || s == "demi bold"_L1)
        return QFont::DemiBold;
    if (s == "medium"_L1)
        return QFont::Medium;
    if (s == "black"_L1)
        return QFont::Black;
    if (s == "light"_L1)
        return QFont::Light;
    if (s == "thin"_L1)
        return QFont::Thin;
    const QStringView s2 = QStringView{s}.mid(2);
    if (s.startsWith("ex"_L1) || s.startsWith("ul"_L1)) {
            if (s2 == "tralight"_L1 || s == "tra light"_L1)
                return QFont::ExtraLight;
            if (s2 == "trabold"_L1 || s2 == "tra bold"_L1)
                return QFont::ExtraBold;
    }

    // Next up, let's see if contains() matches: slightly more expensive, but
    // still fast enough.
    if (s.contains("bold"_L1)) {
        if (s.contains("demi"_L1))
            return QFont::DemiBold;
        return QFont::Bold;
    }
    if (s.contains("thin"_L1))
        return QFont::Thin;
    if (s.contains("light"_L1))
        return QFont::Light;
    if (s.contains("black"_L1))
        return QFont::Black;

    // Now, we perform string translations & comparisons with those.
    // These are (very) slow compared to simple string ops, so we do these last.
    // As using translated values for such things is not very common, this should
    // not be too bad.
    if (s.compare(QCoreApplication::translate("QFontDatabase", "Normal", "The Normal or Regular font weight"), Qt::CaseInsensitive) == 0)
        return QFont::Normal;
    const QString translatedBold = QCoreApplication::translate("QFontDatabase", "Bold").toLower();
    if (s == translatedBold)
        return QFont::Bold;
    if (s.compare(QCoreApplication::translate("QFontDatabase", "Demi Bold"), Qt::CaseInsensitive) == 0)
        return QFont::DemiBold;
    if (s.compare(QCoreApplication::translate("QFontDatabase", "Medium", "The Medium font weight"), Qt::CaseInsensitive) == 0)
        return QFont::Medium;
    if (s.compare(QCoreApplication::translate("QFontDatabase", "Black"), Qt::CaseInsensitive) == 0)
        return QFont::Black;
    const QString translatedLight = QCoreApplication::translate("QFontDatabase", "Light").toLower();
    if (s == translatedLight)
        return QFont::Light;
    if (s.compare(QCoreApplication::translate("QFontDatabase", "Thin"), Qt::CaseInsensitive) == 0)
        return QFont::Thin;
    if (s.compare(QCoreApplication::translate("QFontDatabase", "Extra Light"), Qt::CaseInsensitive) == 0)
        return QFont::ExtraLight;
    if (s.compare(QCoreApplication::translate("QFontDatabase", "Extra Bold"), Qt::CaseInsensitive) == 0)
        return QFont::ExtraBold;

    // And now the contains() checks for the translated strings.
    //: The word for "Extra" as in "Extra Bold, Extra Thin" used as a pattern for string searches
    const QString translatedExtra = QCoreApplication::translate("QFontDatabase", "Extra").toLower();
    if (s.contains(translatedBold)) {
        //: The word for "Demi" as in "Demi Bold" used as a pattern for string searches
        QString translatedDemi = QCoreApplication::translate("QFontDatabase", "Demi").toLower();
        if (s .contains(translatedDemi))
            return QFont::DemiBold;
        if (s.contains(translatedExtra))
            return QFont::ExtraBold;
        return QFont::Bold;
    }

    if (s.contains(translatedLight)) {
        if (s.contains(translatedExtra))
            return QFont::ExtraLight;
        return QFont::Light;
    }
    return QFont::Normal;
}